

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int32 get_quests(node *root,int32 **qarr,int32 *nph,int32 nquests,int32 depth)

{
  int32 *__base;
  long lVar1;
  int nquests_00;
  int iVar2;
  
  while( true ) {
    iVar2 = root->nphones;
    if (3 < depth && (long)iVar2 < 2) {
      return nquests;
    }
    nquests_00 = nquests;
    if (0 < depth) {
      __base = (int32 *)__ckd_calloc__((long)iVar2,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                       ,0x2ba);
      for (lVar1 = 0; lVar1 < root->nphones; lVar1 = lVar1 + 1) {
        __base[lVar1] = root->phoneids[lVar1];
      }
      qsort(__base,(long)root->nphones,4,compare);
      iVar2 = root->nphones;
      nph[nquests] = iVar2;
      nquests_00 = nquests + 1;
      qarr[nquests] = __base;
    }
    if (iVar2 < 2) break;
    depth = depth + 1;
    nquests = nquests_00;
    if (root->left != (node *)0x0) {
      nquests = get_quests(root->left,qarr,nph,nquests_00,depth);
    }
    root = root->right;
    if (root == (node_str *)0x0) {
      return nquests;
    }
  }
  return nquests_00;
}

Assistant:

int32 get_quests(node *root,int32 **qarr,int32 *nph,int32 nquests,int32 depth)
{
    int32 *sortedidx,i;

    if (root->nphones < 2 && depth > 3) return nquests;

    if (depth > 0){
        sortedidx = (int32 *)ckd_calloc(root->nphones,sizeof(int32));
        for (i=0;i<root->nphones;i++) sortedidx[i] = root->phoneids[i];
        qsort(sortedidx,root->nphones,sizeof(int32),compare);
        nph[nquests] = root->nphones;
        qarr[nquests++] = sortedidx;
    }

    if (root->nphones < 2) return nquests;
    if (root->left != NULL) 
        nquests = get_quests(root->left,qarr,nph,nquests,depth+1);
    if (root->right != NULL) 
        nquests = get_quests(root->right,qarr,nph,nquests,depth+1);

    return nquests;
}